

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copyto.cpp
# Opt level: O2

void ncnn::copy_to_image<unsigned_short>(Mat *src,Mat *self,int top,int left)

{
  size_t __n;
  int iVar1;
  void *__dest;
  void *__src;
  bool bVar2;
  
  __src = src->data;
  __dest = (void *)((long)self->data + (long)left * 2 + (long)top * (long)self->w * self->elemsize);
  __n = (long)src->w * 2;
  iVar1 = 0;
  if (0 < src->h) {
    iVar1 = src->h;
  }
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    memcpy(__dest,__src,__n);
    __dest = (void *)((long)__dest + (long)self->w * 2);
    __src = (void *)((long)__src + __n);
  }
  return;
}

Assistant:

static void copy_to_image(const Mat& src, Mat& self, int top, int left)
{
    int w = src.w;
    int h = src.h;

    const T* ptr = src;
    T* outptr = self.row<T>(top) + left;

    for (int y = 0; y < h; y++)
    {
        memcpy(outptr, ptr, w * sizeof(T));
        ptr += w;
        outptr += self.w;
    }
}